

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_rshift_fixed_into(mp_int *r,mp_int *a,size_t bits)

{
  BignumInt BVar1;
  sbyte sVar2;
  ulong local_38;
  size_t i;
  size_t bitoff;
  size_t words;
  size_t bits_local;
  mp_int *a_local;
  mp_int *r_local;
  
  for (local_38 = 0; local_38 < r->nw; local_38 = local_38 + 1) {
    BVar1 = mp_word(a,local_38 + (bits >> 6));
    r->w[local_38] = BVar1;
    if ((bits & 0x3f) != 0) {
      sVar2 = (sbyte)(bits & 0x3f);
      r->w[local_38] = r->w[local_38] >> sVar2;
      BVar1 = mp_word(a,local_38 + (bits >> 6) + 1);
      r->w[local_38] = BVar1 << (0x40U - sVar2 & 0x3f) | r->w[local_38];
    }
  }
  return;
}

Assistant:

void mp_rshift_fixed_into(mp_int *r, mp_int *a, size_t bits)
{
    size_t words = bits / BIGNUM_INT_BITS;
    size_t bitoff = bits % BIGNUM_INT_BITS;

    for (size_t i = 0; i < r->nw; i++) {
        r->w[i] = mp_word(a, i + words);
        if (bitoff != 0) {
            r->w[i] >>= bitoff;
            r->w[i] |= mp_word(a, i + words + 1) << (BIGNUM_INT_BITS - bitoff);
        }
    }
}